

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

int evfilt_read_copyout(kevent *dst,int nevents,filter *filt,knote *src,void *ptr)

{
  byte *pbVar1;
  undefined4 uVar2;
  void *pvVar3;
  uint uVar4;
  uintptr_t uVar5;
  short sVar6;
  unsigned_short uVar7;
  int iVar8;
  stat *__optval;
  __off_t _Var9;
  long lVar10;
  uint uVar11;
  int i;
  socklen_t slen;
  int serr;
  int local_c0 [2];
  stat local_b8;
  
  local_c0[1] = 4;
  uVar4 = src->kn_flags;
  uVar5 = (src->kev).ident;
  uVar2 = *(undefined4 *)((long)&(src->kev).ident + 4);
  sVar6 = (src->kev).filter;
  uVar7 = (src->kev).flags;
  uVar11 = (src->kev).fflags;
  pvVar3 = (src->kev).udata;
  dst->data = (src->kev).data;
  dst->udata = pvVar3;
  *(int *)&dst->ident = (int)uVar5;
  *(undefined4 *)((long)&dst->ident + 4) = uVar2;
  dst->filter = sVar6;
  dst->flags = uVar7;
  dst->fflags = uVar11;
  if ((uVar4 & 1) == 0) {
    uVar11 = *ptr;
    if ((uVar11 & 0x2010) != 0) {
      pbVar1 = (byte *)((long)&dst->flags + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
    if ((uVar11 & 8) != 0) {
      if ((src->kn_flags & 0x3e0) == 0) {
        uVar11 = 5;
      }
      else {
        __optval = &local_b8;
        iVar8 = getsockopt((int)(src->kev).ident,1,4,__optval,(socklen_t *)(local_c0 + 1));
        if (iVar8 < 0) {
          __optval = (stat *)__errno_location();
        }
        uVar11 = (uint)__optval->st_dev;
      }
      dst->fflags = uVar11;
      pbVar1 = (byte *)((long)&dst->flags + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
    if ((src->kn_flags & 0x10) == 0) {
      iVar8 = ioctl((int)dst->ident,0x541b,local_c0);
      if (iVar8 < 0) {
        dst->data = 0;
      }
      else {
        dst->data = (long)local_c0[0];
        if (((long)local_c0[0] == 0) && ((src->kn_flags & 0x20) != 0)) {
          pbVar1 = (byte *)((long)&dst->flags + 1);
          *pbVar1 = *pbVar1 | 0x80;
        }
      }
    }
    else {
      dst->data = 1;
    }
    iVar8 = 0;
    if (((src->kev).flags & 0x80) != 0) {
      iVar8 = knote_disable(filt,src);
    }
    if (((src->kev).flags & 0x10) != 0) {
      iVar8 = knote_delete(filt,src);
    }
    uVar11 = iVar8 >> 0x1f | 1;
  }
  else {
    iVar8 = (int)(src->kev).ident;
    uVar11 = 1;
    _Var9 = lseek(iVar8,0,1);
    iVar8 = fstat(iVar8,&local_b8);
    if (iVar8 < 0) {
      local_b8.st_size = 1;
    }
    lVar10 = 0;
    if (_Var9 != -1) {
      lVar10 = _Var9;
    }
    dst->data = local_b8.st_size - lVar10;
    if (local_b8.st_size - lVar10 == 0) {
      dst->filter = 0;
      iVar8 = epoll_ctl(src->kn_epollfd,2,(src->field_10).kn_timerfd,(epoll_event *)0x0);
      if (iVar8 < 0) {
        uVar11 = 0xffffffff;
      }
      else {
        src->kn_registered = 0;
      }
    }
  }
  return uVar11;
}

Assistant:

int
evfilt_read_copyout(struct kevent *dst, UNUSED int nevents, struct filter *filt,
    struct knote *src, void *ptr)
{
    int ret;
    int serr;
    socklen_t slen = sizeof(serr);
    struct epoll_event * const ev = (struct epoll_event *) ptr;

    /* Special case: for regular files, return the offset from current position to end of file */
    if (src->kn_flags & KNFL_FILE) {
        memcpy(dst, &src->kev, sizeof(*dst));
        dst->data = get_eof_offset(src->kev.ident);

        if (dst->data == 0) {
            dst->filter = 0;    /* Will cause the kevent to be discarded */
            if (epoll_ctl(src->kn_epollfd, EPOLL_CTL_DEL, src->kn_eventfd, NULL) < 0) {
                dbg_perror("epoll_ctl(2)");
                return (-1);
            }
            src->kn_registered = 0;

#if FIXME
            /* XXX-FIXME Switch to using kn_vnode.inotifyfd to monitor for IN_ATTRIB events
                         that may signify the file size has changed.

                         This code is not tested.
             */
            int inofd;
            char path[PATH_MAX];

            inofd = inotify_init();
            if (inofd < 0) {
                dbg_perror("inotify_init(2)");
                (void) close(inofd);
                return (-1);
            }
            src->kn_vnode.inotifyfd = inofd;
            if (linux_fd_to_path(path, sizeof(path), src->kev.ident) < 0)
                return (-1);
            if (inotify_add_watch(inofd, path, IN_ATTRIB) < 0) {
                dbg_perror("inotify_add_watch");
                return (-1);
            }
            if (epoll_ctl(src->kn_epollfd, EPOLL_CTL_ADD, src->kn_vnode.inotifyfd, NULL) < 0) {
                dbg_perror("epoll_ctl(2)");
                return (-1);
            }
            /* FIXME: race here, should we check the EOF status again ? */
#endif
        }

        return (1);
    }

    dbg_printf("epoll_ev=%s", epoll_event_dump(ev));
    memcpy(dst, &src->kev, sizeof(*dst));
#if defined(HAVE_EPOLLRDHUP)
    if (ev->events & EPOLLRDHUP || ev->events & EPOLLHUP)
        dst->flags |= EV_EOF;
#else
    if (ev->events & EPOLLHUP)
        dst->flags |= EV_EOF;
#endif
    if (ev->events & EPOLLERR) {
        if (src->kn_flags & KNFL_SOCKET) {
            ret = getsockopt(src->kev.ident, SOL_SOCKET, SO_ERROR, &serr, &slen);
            dst->fflags = ((ret < 0) ? errno : serr);
        } else
            dst->fflags = EIO;

        /*
         * The only way we seem to be able to signal an error
         * is by setting EOF on the socket.
         */
        dst->flags |= EV_EOF;
    }

    if (src->kn_flags & KNFL_SOCKET_PASSIVE) {
        /* On return, data contains the length of the
           socket backlog. This is not available under Linux.
         */
        dst->data = 1;
    } else {
        /* On return, data contains the number of bytes of protocol
           data available to read.
         */
        int i;
        if (ioctl(dst->ident, SIOCINQ, &i) < 0) {
            /* race condition with socket close, so ignore this error */
            dbg_puts("ioctl(2) of socket failed");
            dst->data = 0;
        } else {
            dst->data = i;
            if (dst->data == 0 && src->kn_flags & KNFL_SOCKET_STREAM)
                dst->flags |= EV_EOF;
        }
    }

    if (knote_copyout_flag_actions(filt, src) < 0) return -1;

    return (1);
}